

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::Option::ByteSizeLong(Option *this)

{
  anon_union_24_1_493b367e_for_Option_3 aVar1;
  size_t sVar2;
  size_t sVar3;
  string *value;
  
  aVar1 = this->field_0;
  if (((undefined1  [24])aVar1 & (undefined1  [24])0x3) == (undefined1  [24])0x0) {
    sVar2 = 0;
  }
  else {
    if ((((undefined1  [24])aVar1 & (undefined1  [24])0x1) == (undefined1  [24])0x0) ||
       (value = (string *)
                ((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc),
       value->_M_string_length == 0)) {
      sVar2 = 0;
    }
    else {
      sVar2 = internal::WireFormatLite::StringSize(value);
      sVar2 = sVar2 + 1;
    }
    if (((undefined1  [24])aVar1 & (undefined1  [24])0x2) != (undefined1  [24])0x0) {
      sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::Any>
                        ((this->field_0)._impl_.value_);
      sVar2 = sVar2 + sVar3 + 1;
    }
  }
  sVar2 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar2,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t Option::ByteSizeLong() const {
  const Option& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.Option)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // string name = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!this_._internal_name().empty()) {
        total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                        this_._internal_name());
      }
    }
    // .google.protobuf.Any value = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.value_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}